

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceMethod
          (Parser *this,MethodDescriptorProto *method,LocationRecorder *method_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *psVar2;
  MethodOptions *mutable_options;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  LocationRecorder location;
  
  text._M_str = "rpc";
  text._M_len = 3;
  bVar1 = Consume(this,text);
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,method_location,1);
    LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,NAME);
    psVar2 = MethodDescriptorProto::_internal_mutable_name_abi_cxx11_(method);
    bVar1 = ConsumeIdentifier(this,psVar2,(ErrorMaker)ZEXT816(0x105c567));
    LocationRecorder::~LocationRecorder(&location);
    if ((bVar1) && (text_00._M_str = "(", text_00._M_len = 1, bVar1 = Consume(this,text_00), bVar1))
    {
      text_01._M_str = "stream";
      text_01._M_len = 6;
      bVar1 = LookingAt(this,text_01);
      if (bVar1) {
        LocationRecorder::LocationRecorder(&location,method_location,5);
        LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,OTHER);
        (method->field_0)._impl_.client_streaming_ = true;
        *(byte *)&method->field_0 = *(byte *)&method->field_0 | 0x10;
        text_02._M_str = "stream";
        text_02._M_len = 6;
        bVar1 = Consume(this,text_02);
        LocationRecorder::~LocationRecorder(&location);
        if (!bVar1) {
          return false;
        }
      }
      LocationRecorder::LocationRecorder(&location,method_location,2);
      LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,INPUT_TYPE);
      psVar2 = MethodDescriptorProto::_internal_mutable_input_type_abi_cxx11_(method);
      bVar1 = ParseUserDefinedType(this,psVar2);
      LocationRecorder::~LocationRecorder(&location);
      if ((((bVar1) &&
           (text_03._M_str = ")", text_03._M_len = 1, bVar1 = Consume(this,text_03), bVar1)) &&
          (text_04._M_str = "returns", text_04._M_len = 7, bVar1 = Consume(this,text_04), bVar1)) &&
         (text_05._M_str = "(", text_05._M_len = 1, bVar1 = Consume(this,text_05), bVar1)) {
        text_06._M_str = "stream";
        text_06._M_len = 6;
        bVar1 = LookingAt(this,text_06);
        if (bVar1) {
          LocationRecorder::LocationRecorder(&location,method_location,6);
          LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,OTHER);
          text_07._M_str = "stream";
          text_07._M_len = 6;
          bVar1 = Consume(this,text_07);
          if (!bVar1) {
            LocationRecorder::~LocationRecorder(&location);
            return false;
          }
          (method->field_0)._impl_.server_streaming_ = true;
          *(byte *)&method->field_0 = *(byte *)&method->field_0 | 0x20;
          LocationRecorder::~LocationRecorder(&location);
        }
        LocationRecorder::LocationRecorder(&location,method_location,3);
        LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,OUTPUT_TYPE);
        psVar2 = MethodDescriptorProto::_internal_mutable_output_type_abi_cxx11_(method);
        bVar1 = ParseUserDefinedType(this,psVar2);
        LocationRecorder::~LocationRecorder(&location);
        if ((bVar1) &&
           (text_08._M_str = ")", text_08._M_len = 1, bVar1 = Consume(this,text_08), bVar1)) {
          text_09._M_str = "{";
          text_09._M_len = 1;
          bVar1 = LookingAt(this,text_09);
          if (bVar1) {
            mutable_options = MethodDescriptorProto::mutable_options(method);
            bVar1 = ParseMethodOptions(this,method_location,containing_file,4,
                                       &mutable_options->super_Message);
          }
          else {
            text_10._M_str = ";";
            text_10._M_len = 1;
            bVar1 = ConsumeEndOfDeclaration(this,text_10,method_location);
          }
          if (bVar1 != false) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceMethod(MethodDescriptorProto* method,
                                const LocationRecorder& method_location,
                                const FileDescriptorProto* containing_file) {
  DO(Consume("rpc"));

  {
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(method, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(method->mutable_name(), "Expected method name."));
  }

  // Parse input type.
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kClientStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      method->set_client_streaming(true);
      DO(Consume("stream"));
    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kInputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::INPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_input_type()));
  }
  DO(Consume(")"));

  // Parse output type.
  DO(Consume("returns"));
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kServerStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      DO(Consume("stream"));
      method->set_server_streaming(true);
    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kOutputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::OUTPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_output_type()));
  }
  DO(Consume(")"));

  if (LookingAt("{")) {
    // Options!
    DO(ParseMethodOptions(method_location, containing_file,
                          MethodDescriptorProto::kOptionsFieldNumber,
                          method->mutable_options()));
  } else {
    DO(ConsumeEndOfDeclaration(";", &method_location));
  }

  return true;
}